

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O3

void __thiscall deqp::gles2::Functional::anon_unknown_0::PointCase::testRender(PointCase *this)

{
  ostringstream *poVar1;
  TextureFormat log;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  RenderTarget *pRVar8;
  RenderTarget *pRVar9;
  ConstPixelBufferAccess *pCVar10;
  Vec4 *p;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  bool bVar11;
  ulong uVar12;
  Context *ctx;
  GLContext *this_00;
  ChannelOrder __fd;
  void *pvVar13;
  long lVar14;
  Surface refSurface;
  Surface diffMask;
  Surface testSurface;
  Surface *dstSurface;
  ReferenceContextBuffers buffers;
  PositionColorShader program;
  GLContext glesContext;
  ReferenceContext refContext;
  Surface local_6ac0;
  Surface local_6aa8;
  Surface local_6a90;
  Surface *local_6a78;
  string local_6a70;
  string local_6a50;
  string local_6a30;
  string local_6a10;
  string local_69f0;
  TextureFormat local_69d0;
  string local_69c8;
  string local_69a8;
  string local_6988;
  LogImage local_6968;
  LogImageSet local_68d8;
  LogImage local_6898;
  undefined1 local_6808 [120];
  ios_base local_6790 [264];
  ReferenceContextLimits local_6688;
  LogImage local_6630;
  ReferenceContextBuffers local_65a0;
  ConstPixelBufferAccess local_6528;
  ConstPixelBufferAccess local_6500;
  ConstPixelBufferAccess local_64d8;
  ShaderProgram local_64b0;
  GLContext local_6358;
  _func_int **local_61e8;
  undefined8 uStack_61e0;
  
  pRVar8 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  iVar7 = 1;
  if (1 < pRVar8->m_numSamples) {
    iVar7 = pRVar8->m_numSamples;
  }
  log = (TextureFormat)
        ((this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  local_61e8 = (_func_int **)0x0;
  uStack_61e0._0_4_ = (ApiType)0xc8;
  uStack_61e0._4_4_ = 200;
  this_00 = &local_6358;
  sglr::GLContext::GLContext
            (this_00,((this->super_RenderTestCase).super_TestCase.m_context)->m_renderCtx,
             (TestLog *)log,0,(IVec4 *)&local_61e8);
  local_6688.extensionStr._M_dataplus._M_p = (pointer)&local_6688.extensionStr.field_2;
  local_6688.contextType.super_ApiType.m_bits = (ApiType)0x3;
  local_6688.maxTextureImageUnits = 0x10;
  local_6688.maxTexture2DSize = 0x800;
  local_6688.maxTextureCubeSize = 0x800;
  local_6688.maxTexture2DArrayLayers = 0x100;
  local_6688.maxTexture3DSize = 0x100;
  local_6688.maxRenderbufferSize = 0x800;
  local_6688.maxVertexAttribs = 0x10;
  local_6688.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6688.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6688.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6688.extensionStr._M_string_length = 0;
  local_6688.extensionStr.field_2._M_local_buf[0] = '\0';
  pRVar8 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  pRVar9 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (&local_65a0,&pRVar8->m_pixelFormat,pRVar9->m_depthBits,0,200,200,iVar7);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_6808,&local_65a0.m_colorbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)local_6808);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_6808,&local_65a0.m_depthbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)local_6808);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_6808,&local_65a0.m_stencilbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)local_6808);
  sglr::ReferenceContext::ReferenceContext
            ((ReferenceContext *)&local_61e8,&local_6688,(MultisamplePixelBufferAccess *)&local_64b0
             ,(MultisamplePixelBufferAccess *)&local_6968,
             (MultisamplePixelBufferAccess *)&local_6898);
  PositionColorShader::PositionColorShader((PositionColorShader *)&local_64b0);
  tcu::Surface::Surface(&local_6a90,200,200);
  tcu::Surface::Surface(&local_6ac0,200,200);
  poVar1 = (ostringstream *)(local_6808 + 8);
  local_6808._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Viewport: left=",0xf);
  std::ostream::operator<<(poVar1,(this->m_viewport).left);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tbottom=",8);
  std::ostream::operator<<(poVar1,(this->m_viewport).bottom);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\twidth=",7);
  std::ostream::operator<<(poVar1,(this->m_viewport).width);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\theight=",8);
  std::ostream::operator<<(poVar1,(this->m_viewport).height);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_6808,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_6790);
  poVar1 = (ostringstream *)(local_6808 + 8);
  local_6808._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  local_6a78 = &local_6a90;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Rendering points with point size ",0x21);
  std::ostream::_M_insert<double>((double)this->m_pointSize);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Coordinates:",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_6808,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_6790);
  if ((this->m_points).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->m_points).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    poVar1 = (ostringstream *)(local_6808 + 8);
    lVar14 = 0;
    uVar12 = 0;
    do {
      local_6808._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tx=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)((this->m_points).
                                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                   lVar14));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ty=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)((this->m_points).
                                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                   lVar14 + 4));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tz=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)((this->m_points).
                                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                   lVar14 + 8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tw=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)((this->m_points).
                                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                   lVar14 + 0xc));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
      Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
                (&local_6968.m_name,
                 (_anonymous_namespace_ *)
                 ((long)((this->m_points).
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14),p);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_6968.m_name._M_dataplus._M_p,
                 local_6968.m_name._M_string_length);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_6808,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6968.m_name._M_dataplus._M_p != &local_6968.m_name.field_2) {
        operator_delete(local_6968.m_name._M_dataplus._M_p,
                        local_6968.m_name.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_6790);
      uVar12 = uVar12 + 1;
      lVar14 = lVar14 + 0x10;
    } while (uVar12 < (ulong)((long)(this->m_points).
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_points).
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  bVar2 = true;
  do {
    bVar11 = bVar2;
    uVar3 = (*(this_00->super_Context)._vptr_Context[0x75])(this_00,&local_64b0);
    uVar4 = (*(this_00->super_Context)._vptr_Context[0x59])(this_00,(ulong)uVar3,"a_position");
    uVar5 = (*(this_00->super_Context)._vptr_Context[0x59])(this_00,(ulong)uVar3,"a_pointSize");
    uVar6 = (*(this_00->super_Context)._vptr_Context[0x59])(this_00,(ulong)uVar3,"a_color");
    (*(this_00->super_Context)._vptr_Context[0x2a])(0,0,0,0x3f800000,this_00);
    (*(this_00->super_Context)._vptr_Context[0x2b])(0x3f800000,this_00);
    (*(this_00->super_Context)._vptr_Context[0x2d])(this_00,0x4100);
    (*(this_00->super_Context)._vptr_Context[5])
              (this_00,(ulong)(uint)(this->m_viewport).left,(ulong)(uint)(this->m_viewport).bottom,
               (ulong)(uint)(this->m_viewport).width,(ulong)(uint)(this->m_viewport).height);
    (*(this_00->super_Context)._vptr_Context[0x76])(this_00,(ulong)uVar3);
    (*(this_00->super_Context)._vptr_Context[0x50])(this_00,(ulong)uVar4);
    (*(this_00->super_Context)._vptr_Context[0x4e])
              (this_00,(ulong)uVar4,4,0x1406,0,0,
               (this->m_points).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    (*(this_00->super_Context)._vptr_Context[0x53])(this->m_pointSize,this_00,(ulong)uVar5);
    (*(this_00->super_Context)._vptr_Context[0x56])(this_00,(ulong)uVar6);
    (*(this_00->super_Context)._vptr_Context[0x68])
              (this_00,0,0,
               (ulong)((long)(this->m_points).
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_points).
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4);
    (*(this_00->super_Context)._vptr_Context[0x51])(this_00,(ulong)uVar4);
    (*(this_00->super_Context)._vptr_Context[0x76])(this_00,0);
    (*(this_00->super_Context)._vptr_Context[0x77])(this_00,(ulong)uVar3);
    (*(this_00->super_Context)._vptr_Context[0x7a])(this_00);
    (*(this_00->super_Context)._vptr_Context[0x80])(this_00,local_6a78,0,0,200);
    local_6a78 = &local_6ac0;
    this_00 = (GLContext *)&local_61e8;
    bVar2 = false;
  } while (bVar11);
  tcu::Surface::Surface(&local_6aa8,200,200);
  poVar1 = (ostringstream *)(local_6808 + 8);
  local_6808._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Comparing images... ",0x14);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_6808,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_6790);
  poVar1 = (ostringstream *)(local_6808 + 8);
  local_6808._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Deviation within radius of ",0x1b);
  std::ostream::operator<<(poVar1,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," is allowed.",0xc);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_6808,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_6790);
  local_6968.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar13 = (void *)local_6a90.m_pixels.m_cap;
  if ((void *)local_6a90.m_pixels.m_cap != (void *)0x0) {
    pvVar13 = local_6a90.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_6808,(TextureFormat *)&local_6968,local_6a90.m_width,
             local_6a90.m_height,1,pvVar13);
  local_6898.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar13 = (void *)local_6ac0.m_pixels.m_cap;
  if ((void *)local_6ac0.m_pixels.m_cap != (void *)0x0) {
    pvVar13 = local_6ac0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_6968,(TextureFormat *)&local_6898,local_6ac0.m_width,
             local_6ac0.m_height,1,pvVar13);
  local_6630.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar13 = (void *)local_6aa8.m_pixels.m_cap;
  if ((void *)local_6aa8.m_pixels.m_cap != (void *)0x0) {
    pvVar13 = local_6aa8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_6898,(TextureFormat *)&local_6630,local_6aa8.m_width,
             local_6aa8.m_height,1,pvVar13);
  iVar7 = compareImages((TestLog *)log,(ConstPixelBufferAccess *)local_6808,
                        (ConstPixelBufferAccess *)&local_6968,(PixelBufferAccess *)&local_6898,1,
                        compareBlackNonBlackPixels);
  if (0 < iVar7) {
    local_6988._M_dataplus._M_p = (pointer)&local_6988.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6988,"Images","");
    local_69f0._M_dataplus._M_p = (pointer)&local_69f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_69f0,"Image comparison","");
    tcu::LogImageSet::LogImageSet(&local_68d8,&local_6988,&local_69f0);
    tcu::TestLog::startImageSet
              ((TestLog *)log,local_68d8.m_name._M_dataplus._M_p,
               local_68d8.m_description._M_dataplus._M_p);
    local_6a10._M_dataplus._M_p = (pointer)&local_6a10.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a10,"TestImage","");
    local_6a30._M_dataplus._M_p = (pointer)&local_6a30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a30,"Test image","");
    local_6898.m_name._M_dataplus._M_p = (pointer)0x300000008;
    if ((void *)local_6a90.m_pixels.m_cap != (void *)0x0) {
      local_6a90.m_pixels.m_cap = (size_t)local_6a90.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_64d8,(TextureFormat *)&local_6898,local_6a90.m_width,
               local_6a90.m_height,1,(void *)local_6a90.m_pixels.m_cap);
    pCVar10 = &local_64d8;
    tcu::LogImage::LogImage
              (&local_6968,&local_6a10,&local_6a30,pCVar10,QP_IMAGE_COMPRESSION_MODE_BEST);
    __fd = log.order;
    tcu::LogImage::write(&local_6968,__fd,__buf,(size_t)pCVar10);
    local_6a50._M_dataplus._M_p = (pointer)&local_6a50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a50,"ReferenceImage","");
    local_6a70._M_dataplus._M_p = (pointer)&local_6a70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a70,"Reference image","");
    local_6630.m_name._M_dataplus._M_p = (pointer)0x300000008;
    if ((void *)local_6ac0.m_pixels.m_cap != (void *)0x0) {
      local_6ac0.m_pixels.m_cap = (size_t)local_6ac0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_6500,(TextureFormat *)&local_6630,local_6ac0.m_width,
               local_6ac0.m_height,1,(void *)local_6ac0.m_pixels.m_cap);
    pCVar10 = &local_6500;
    tcu::LogImage::LogImage
              (&local_6898,&local_6a50,&local_6a70,pCVar10,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_6898,__fd,__buf_00,(size_t)pCVar10);
    local_69a8._M_dataplus._M_p = (pointer)&local_69a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_69a8,"DifferenceMask","");
    local_69c8._M_dataplus._M_p = (pointer)&local_69c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_69c8,"Difference mask","");
    local_69d0.order = RGBA;
    local_69d0.type = UNORM_INT8;
    if ((void *)local_6aa8.m_pixels.m_cap != (void *)0x0) {
      local_6aa8.m_pixels.m_cap = (size_t)local_6aa8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_6528,&local_69d0,local_6aa8.m_width,local_6aa8.m_height,1
               ,(void *)local_6aa8.m_pixels.m_cap);
    pCVar10 = &local_6528;
    tcu::LogImage::LogImage
              (&local_6630,&local_69a8,&local_69c8,pCVar10,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_6630,__fd,__buf_01,(size_t)pCVar10);
    tcu::TestLog::endImageSet((TestLog *)log);
    poVar1 = (ostringstream *)(local_6808 + 8);
    local_6808._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Got ",4);
    std::ostream::operator<<(poVar1,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," faulty pixel(s).",0x11);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_6808,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_6790);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6630.m_description._M_dataplus._M_p != &local_6630.m_description.field_2) {
      operator_delete(local_6630.m_description._M_dataplus._M_p,
                      local_6630.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6630.m_name._M_dataplus._M_p != &local_6630.m_name.field_2) {
      operator_delete(local_6630.m_name._M_dataplus._M_p,
                      local_6630.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_69c8._M_dataplus._M_p != &local_69c8.field_2) {
      operator_delete(local_69c8._M_dataplus._M_p,local_69c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_69a8._M_dataplus._M_p != &local_69a8.field_2) {
      operator_delete(local_69a8._M_dataplus._M_p,local_69a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6898.m_description._M_dataplus._M_p != &local_6898.m_description.field_2) {
      operator_delete(local_6898.m_description._M_dataplus._M_p,
                      local_6898.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6898.m_name._M_dataplus._M_p != &local_6898.m_name.field_2) {
      operator_delete(local_6898.m_name._M_dataplus._M_p,
                      local_6898.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a70._M_dataplus._M_p != &local_6a70.field_2) {
      operator_delete(local_6a70._M_dataplus._M_p,local_6a70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a50._M_dataplus._M_p != &local_6a50.field_2) {
      operator_delete(local_6a50._M_dataplus._M_p,local_6a50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6968.m_description._M_dataplus._M_p != &local_6968.m_description.field_2) {
      operator_delete(local_6968.m_description._M_dataplus._M_p,
                      local_6968.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6968.m_name._M_dataplus._M_p != &local_6968.m_name.field_2) {
      operator_delete(local_6968.m_name._M_dataplus._M_p,
                      local_6968.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a30._M_dataplus._M_p != &local_6a30.field_2) {
      operator_delete(local_6a30._M_dataplus._M_p,local_6a30.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a10._M_dataplus._M_p != &local_6a10.field_2) {
      operator_delete(local_6a10._M_dataplus._M_p,local_6a10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68d8.m_description._M_dataplus._M_p != &local_68d8.m_description.field_2) {
      operator_delete(local_68d8.m_description._M_dataplus._M_p,
                      local_68d8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68d8.m_name._M_dataplus._M_p != &local_68d8.m_name.field_2) {
      operator_delete(local_68d8.m_name._M_dataplus._M_p,
                      local_68d8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_69f0._M_dataplus._M_p != &local_69f0.field_2) {
      operator_delete(local_69f0._M_dataplus._M_p,local_69f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6988._M_dataplus._M_p != &local_6988.field_2) {
      operator_delete(local_6988._M_dataplus._M_p,local_6988.field_2._M_allocated_capacity + 1);
    }
    tcu::TestContext::setTestResult
              ((this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Got faulty pixels");
  }
  tcu::Surface::~Surface(&local_6aa8);
  tcu::Surface::~Surface(&local_6ac0);
  tcu::Surface::~Surface(&local_6a90);
  sglr::ShaderProgram::~ShaderProgram(&local_64b0);
  sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)&local_61e8);
  tcu::TextureLevel::~TextureLevel(&local_65a0.m_stencilbuffer);
  tcu::TextureLevel::~TextureLevel(&local_65a0.m_depthbuffer);
  tcu::TextureLevel::~TextureLevel(&local_65a0.m_colorbuffer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6688.extensionStr._M_dataplus._M_p != &local_6688.extensionStr.field_2) {
    operator_delete(local_6688.extensionStr._M_dataplus._M_p,
                    CONCAT71(local_6688.extensionStr.field_2._M_allocated_capacity._1_7_,
                             local_6688.extensionStr.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6688.extensionList);
  sglr::GLContext::~GLContext(&local_6358);
  return;
}

Assistant:

void PointCase::testRender (void)
{
	using tcu::TestLog;

	const int numSamples			= de::max(m_context.getRenderTarget().getNumSamples(), 1);

	tcu::TestLog&					log			= m_testCtx.getLog();
	sglr::GLContext					glesContext	(m_context.getRenderContext(), log, 0, tcu::IVec4(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE));
	sglr::ReferenceContextLimits	limits;
	sglr::ReferenceContextBuffers	buffers		(m_context.getRenderTarget().getPixelFormat(), m_context.getRenderTarget().getDepthBits(), 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE, numSamples);
	sglr::ReferenceContext			refContext	(limits, buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());
	PositionColorShader				program;
	tcu::Surface					testSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::Surface					refSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	sglr::Context*					contexts[2] = {&glesContext, &refContext};
	tcu::Surface*					surfaces[2] = {&testSurface, &refSurface};

	// log the purpose of the test
	log << TestLog::Message << "Viewport: left=" << m_viewport.left << "\tbottom=" << m_viewport.bottom << "\twidth=" << m_viewport.width << "\theight=" << m_viewport.height << TestLog::EndMessage;
	log << TestLog::Message << "Rendering points with point size " << m_pointSize << ". Coordinates:" << TestLog::EndMessage;
	for (size_t ndx = 0; ndx < m_points.size(); ++ndx)
		log << TestLog::Message
				<< "\tx=" << m_points[ndx].x()
				<< "\ty=" << m_points[ndx].y()
				<< "\tz=" << m_points[ndx].z()
				<< "\tw=" << m_points[ndx].w()
				<< "\t" << genClippingPointInfoString(m_points[ndx])
				<< TestLog::EndMessage;

	for (int contextNdx = 0; contextNdx < 2; ++contextNdx)
	{
		sglr::Context&	ctx				= *contexts[contextNdx];
		tcu::Surface&	dstSurface		= *surfaces[contextNdx];
		const deUint32	programId		= ctx.createProgram(&program);
		const GLint		positionLoc		= ctx.getAttribLocation(programId, "a_position");
		const GLint		pointSizeLoc	= ctx.getAttribLocation(programId, "a_pointSize");
		const GLint		colorLoc		= ctx.getAttribLocation(programId, "a_color");

		ctx.clearColor					(0, 0, 0, 1);
		ctx.clearDepthf					(1.0f);
		ctx.clear						(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		ctx.viewport					(m_viewport.left, m_viewport.bottom, m_viewport.width, m_viewport.height);
		ctx.useProgram					(programId);
		ctx.enableVertexAttribArray		(positionLoc);
		ctx.vertexAttribPointer			(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &m_points[0]);
		ctx.vertexAttrib1f				(pointSizeLoc, m_pointSize);
		ctx.vertexAttrib4f				(colorLoc, 1.0f, 1.0f, 1.0f, 1.0f);
		ctx.drawArrays					(GL_POINTS, 0, (glw::GLsizei)m_points.size());
		ctx.disableVertexAttribArray	(positionLoc);
		ctx.useProgram					(0);
		ctx.deleteProgram				(programId);
		ctx.finish						();

		ctx.readPixels(dstSurface, 0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	}

	// do the comparison
	{
		tcu::Surface		diffMask		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		const int			kernelRadius	= 1;
		int					faultyPixels;

		log << TestLog::Message << "Comparing images... " << TestLog::EndMessage;
		log << TestLog::Message << "Deviation within radius of " << kernelRadius << " is allowed." << TestLog::EndMessage;

		faultyPixels = compareBlackNonBlackImages(log, testSurface.getAccess(), refSurface.getAccess(), diffMask.getAccess(), kernelRadius);

		if (faultyPixels > 0)
		{
			log << TestLog::ImageSet("Images", "Image comparison")
				<< TestLog::Image("TestImage", "Test image", testSurface.getAccess())
				<< TestLog::Image("ReferenceImage", "Reference image", refSurface.getAccess())
				<< TestLog::Image("DifferenceMask", "Difference mask", diffMask.getAccess())
				<< TestLog::EndImageSet
				<< tcu::TestLog::Message << "Got " << faultyPixels << " faulty pixel(s)." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got faulty pixels");
		}
	}
}